

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rl_gputex.h
# Opt level: O1

void * rl_load_dds_from_memory
                 (uchar *file_data,uint file_size,int *width,int *height,int *format,int *mips)

{
  uchar *__src;
  ushort *puVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  int iVar8;
  
  if (file_data != (uchar *)0x0) {
    if ((((*file_data != 'D') || (file_data[1] != 'D')) || (file_data[2] != 'S')) ||
       (file_data[3] != ' ')) {
      printf("WARNING: IMAGE: DDS file data not valid",CONCAT44(in_register_00000034,file_size));
      return (void *)0x0;
    }
    *width = *(int *)(file_data + 0x10);
    *height = *(int *)(file_data + 0xc);
    if ((*width & 3) != 0) {
      printf("WARNING: IMAGE: DDS file width must be multiple of 4. Image will not display correctly"
             ,CONCAT44(in_register_00000034,file_size));
    }
    if ((*height & 3) != 0) {
      printf(
            "WARNING: IMAGE: DDS file height must be multiple of 4. Image will not display correctly"
            );
    }
    __src = file_data + 0x80;
    uVar7 = *(int *)(file_data + 0xc) * *(int *)(file_data + 0x10);
    *mips = *(int *)(file_data + 0x1c) + (uint)(*(int *)(file_data + 0x1c) == 0);
    uVar3 = *(uint *)(file_data + 0x50);
    iVar8 = *(int *)(file_data + 0x58);
    if (iVar8 == 0x10) {
      if (uVar3 == 0x41) {
        if (*(int *)(file_data + 0x68) == 0xf000) {
          iVar8 = uVar7 * 2;
          if (1 < *(uint *)(file_data + 0x1c)) {
            iVar8 = iVar8 + iVar8 / 3;
          }
          pvVar5 = malloc((long)iVar8);
          memcpy(pvVar5,__src,(long)iVar8);
          if (0 < (int)uVar7) {
            uVar6 = 0;
            do {
              puVar1 = (ushort *)((long)pvVar5 + uVar6 * 2);
              *puVar1 = *puVar1 << 4 | *puVar1 >> 0xc;
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
          *format = 6;
          return pvVar5;
        }
        if (*(int *)(file_data + 0x68) == 0x8000) {
          iVar8 = uVar7 * 2;
          if (1 < *(uint *)(file_data + 0x1c)) {
            iVar8 = iVar8 + iVar8 / 3;
          }
          pvVar5 = malloc((long)iVar8);
          memcpy(pvVar5,__src,(long)iVar8);
          if (0 < (int)uVar7) {
            uVar6 = 0;
            do {
              puVar1 = (ushort *)((long)pvVar5 + uVar6 * 2);
              *puVar1 = *puVar1 << 1 | (ushort)((short)*puVar1 < 0);
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
          *format = 5;
          return pvVar5;
        }
      }
      else if (uVar3 == 0x40) {
        iVar8 = uVar7 * 2;
        if (1 < *(uint *)(file_data + 0x1c)) {
          iVar8 = iVar8 + iVar8 / 3;
        }
        pvVar5 = malloc((long)iVar8);
        memcpy(pvVar5,__src,(long)iVar8);
        *format = 3;
        return pvVar5;
      }
    }
    else {
      if (iVar8 == 0x18 && uVar3 == 0x40) {
        iVar8 = uVar7 * 4;
        if (*(uint *)(file_data + 0x1c) < 2) {
          iVar8 = uVar7 * 3;
        }
        pvVar5 = malloc((long)iVar8);
        memcpy(pvVar5,__src,(long)iVar8);
        *format = 4;
        return pvVar5;
      }
      if (iVar8 == 0x20 && uVar3 == 0x41) {
        uVar3 = uVar7 * 4;
        uVar4 = uVar3;
        if (1 < *(uint *)(file_data + 0x1c)) {
          uVar4 = (int)uVar3 / 3 + uVar3;
        }
        pvVar5 = malloc((long)(int)uVar4);
        memcpy(pvVar5,__src,(long)(int)uVar4);
        if (0 < (int)uVar7) {
          uVar6 = 0;
          do {
            uVar2 = *(undefined1 *)((long)pvVar5 + uVar6);
            *(undefined1 *)((long)pvVar5 + uVar6) = *(undefined1 *)((long)pvVar5 + uVar6 + 2);
            *(undefined1 *)((long)pvVar5 + uVar6 + 2) = uVar2;
            uVar6 = uVar6 + 4;
          } while (uVar6 < uVar3);
        }
        *format = 7;
        return pvVar5;
      }
      if (((uVar3 & 0xfffffffe) == 4) && (iVar8 = *(int *)(file_data + 0x54), iVar8 != 0)) {
        uVar7 = *(uint *)(file_data + 0x14);
        if (1 < *(uint *)(file_data + 0x1c)) {
          uVar7 = (uint)((ulong)uVar7 * 0x2aaaaaaab >> 0x21);
        }
        pvVar5 = malloc((long)(int)uVar7);
        memcpy(pvVar5,__src,(long)(int)uVar7);
        if (iVar8 == 0x35545844) {
          *format = 0x11;
          return pvVar5;
        }
        if (iVar8 == 0x33545844) {
          *format = 0x10;
          return pvVar5;
        }
        if (iVar8 != 0x31545844) {
          return pvVar5;
        }
        if (uVar3 == 4) {
          *format = 0xe;
          return pvVar5;
        }
        *format = 0xf;
        return pvVar5;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *rl_load_dds_from_memory(const unsigned char *file_data, unsigned int file_size, int *width, int *height, int *format, int *mips)
{
    void *image_data = NULL;        // Image data pointer
    int image_pixel_size = 0;       // Image pixel size

    unsigned char *file_data_ptr = (unsigned char *)file_data;

    // Required extension:
    // GL_EXT_texture_compression_s3tc

    // Supported tokens (defined by extensions)
    // GL_COMPRESSED_RGB_S3TC_DXT1_EXT      0x83F0
    // GL_COMPRESSED_RGBA_S3TC_DXT1_EXT     0x83F1
    // GL_COMPRESSED_RGBA_S3TC_DXT3_EXT     0x83F2
    // GL_COMPRESSED_RGBA_S3TC_DXT5_EXT     0x83F3

    #define FOURCC_DXT1 0x31545844  // Equivalent to "DXT1" in ASCII
    #define FOURCC_DXT3 0x33545844  // Equivalent to "DXT3" in ASCII
    #define FOURCC_DXT5 0x35545844  // Equivalent to "DXT5" in ASCII

    // DDS Pixel Format
    typedef struct {
        unsigned int size;
        unsigned int flags;
        unsigned int fourcc;
        unsigned int rgb_bit_count;
        unsigned int r_bit_mask;
        unsigned int g_bit_mask;
        unsigned int b_bit_mask;
        unsigned int a_bit_mask;
    } dds_pixel_format;

    // DDS Header (124 bytes)
    typedef struct {
        unsigned int size;
        unsigned int flags;
        unsigned int height;
        unsigned int width;
        unsigned int pitch_or_linear_size;
        unsigned int depth;
        unsigned int mipmap_count;
        unsigned int reserved1[11];
        dds_pixel_format ddspf;
        unsigned int caps;
        unsigned int caps2;
        unsigned int caps3;
        unsigned int caps4;
        unsigned int reserved2;
    } dds_header;

    if (file_data_ptr != NULL)
    {
        // Verify the type of file
        unsigned char *dds_header_id = file_data_ptr;
        file_data_ptr += 4;

        if ((dds_header_id[0] != 'D') || (dds_header_id[1] != 'D') || (dds_header_id[2] != 'S') || (dds_header_id[3] != ' '))
        {
            LOG("WARNING: IMAGE: DDS file data not valid");
        }
        else
        {
            dds_header *header = (dds_header *)file_data_ptr;

            file_data_ptr += sizeof(dds_header);        // Skip header

            *width = header->width;
            *height = header->height;

            if (*width % 4 != 0) LOG("WARNING: IMAGE: DDS file width must be multiple of 4. Image will not display correctly");
            if (*height % 4 != 0) LOG("WARNING: IMAGE: DDS file height must be multiple of 4. Image will not display correctly");

            image_pixel_size = header->width*header->height;

            if (header->mipmap_count == 0) *mips = 1;   // Parameter not used
            else *mips = header->mipmap_count;

            if (header->ddspf.rgb_bit_count == 16)      // 16bit mode, no compressed
            {
                if (header->ddspf.flags == 0x40)        // No alpha channel
                {
                    int data_size = image_pixel_size*sizeof(unsigned short);
                    if (header->mipmap_count > 1) data_size = data_size + data_size / 3;
                    image_data = RL_MALLOC(data_size);

                    memcpy(image_data, file_data_ptr, data_size);

                    *format = PIXELFORMAT_UNCOMPRESSED_R5G6B5;
                }
                else if (header->ddspf.flags == 0x41)           // With alpha channel
                {
                    if (header->ddspf.a_bit_mask == 0x8000)     // 1bit alpha
                    {
                        int data_size = image_pixel_size*sizeof(unsigned short);
                        if (header->mipmap_count > 1) data_size = data_size + data_size / 3;
                        image_data = RL_MALLOC(data_size);

                        memcpy(image_data, file_data_ptr, data_size);

                        unsigned char alpha = 0;

                        // NOTE: Data comes as A1R5G5B5, it must be reordered to R5G5B5A1
                        for (int i = 0; i < image_pixel_size; i++)
                        {
                            alpha = ((unsigned short *)image_data)[i] >> 15;
                            ((unsigned short *)image_data)[i] = ((unsigned short *)image_data)[i] << 1;
                            ((unsigned short *)image_data)[i] += alpha;
                        }

                        *format = PIXELFORMAT_UNCOMPRESSED_R5G5B5A1;
                    }
                    else if (header->ddspf.a_bit_mask == 0xf000)   // 4bit alpha
                    {
                        int data_size = image_pixel_size*sizeof(unsigned short);
                        if (header->mipmap_count > 1) data_size = data_size + data_size / 3;
                        image_data = RL_MALLOC(data_size);

                        memcpy(image_data, file_data_ptr, data_size);

                        unsigned char alpha = 0;

                        // NOTE: Data comes as A4R4G4B4, it must be reordered R4G4B4A4
                        for (int i = 0; i < image_pixel_size; i++)
                        {
                            alpha = ((unsigned short *)image_data)[i] >> 12;
                            ((unsigned short *)image_data)[i] = ((unsigned short *)image_data)[i] << 4;
                            ((unsigned short *)image_data)[i] += alpha;
                        }

                        *format = PIXELFORMAT_UNCOMPRESSED_R4G4B4A4;
                    }
                }
            }
            else if ((header->ddspf.flags == 0x40) && (header->ddspf.rgb_bit_count == 24))   // DDS_RGB, no compressed
            {
                int data_size = image_pixel_size*3*sizeof(unsigned char);
                if (header->mipmap_count > 1) data_size = data_size + data_size / 3;
                image_data = RL_MALLOC(data_size);

                memcpy(image_data, file_data_ptr, data_size);

                *format = PIXELFORMAT_UNCOMPRESSED_R8G8B8;
            }
            else if ((header->ddspf.flags == 0x41) && (header->ddspf.rgb_bit_count == 32)) // DDS_RGBA, no compressed
            {
                int data_size = image_pixel_size*4*sizeof(unsigned char);
                if (header->mipmap_count > 1) data_size = data_size + data_size / 3;
                image_data = RL_MALLOC(data_size);

                memcpy(image_data, file_data_ptr, data_size);

                unsigned char blue = 0;

                // NOTE: Data comes as A8R8G8B8, it must be reordered R8G8B8A8 (view next comment)
                // DirecX understand ARGB as a 32bit DWORD but the actual memory byte alignment is BGRA
                // So, we must realign B8G8R8A8 to R8G8B8A8
                for (int i = 0; i < image_pixel_size*4; i += 4)
                {
                    blue = ((unsigned char *)image_data)[i];
                    ((unsigned char *)image_data)[i] = ((unsigned char *)image_data)[i + 2];
                    ((unsigned char *)image_data)[i + 2] = blue;
                }

                *format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
            }
            else if (((header->ddspf.flags == 0x04) || (header->ddspf.flags == 0x05)) && (header->ddspf.fourcc > 0)) // Compressed
            {
                int data_size = 0;

                // Calculate data size, including all mipmaps
                if (header->mipmap_count > 1) data_size = header->pitch_or_linear_size + header->pitch_or_linear_size / 3;
                else data_size = header->pitch_or_linear_size;

                image_data = RL_MALLOC(data_size*sizeof(unsigned char));

                memcpy(image_data, file_data_ptr, data_size);

                switch (header->ddspf.fourcc)
                {
                    case FOURCC_DXT1:
                    {
                        if (header->ddspf.flags == 0x04) *format = PIXELFORMAT_COMPRESSED_DXT1_RGB;
                        else *format = PIXELFORMAT_COMPRESSED_DXT1_RGBA;
                    } break;
                    case FOURCC_DXT3: *format = PIXELFORMAT_COMPRESSED_DXT3_RGBA; break;
                    case FOURCC_DXT5: *format = PIXELFORMAT_COMPRESSED_DXT5_RGBA; break;
                    default: break;
                }
            }
        }
    }

    return image_data;
}